

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O2

void __thiscall FListMenuItemPlayerDisplay::Ticker(FListMenuItemPlayerDisplay *this)

{
  FState *this_00;
  int iVar1;
  
  if (this->mClassNum < 0) {
    UpdateRandomClass(this);
  }
  if (this->mPlayerState != (FState *)0x0) {
    iVar1 = FState::GetTics(this->mPlayerState);
    if (((iVar1 != -1) && (this_00 = this->mPlayerState->NextState, this_00 != (FState *)0x0)) &&
       (iVar1 = this->mPlayerTics, this->mPlayerTics = iVar1 + -1, iVar1 < 2)) {
      this->mPlayerState = this_00;
      iVar1 = FState::GetTics(this_00);
      this->mPlayerTics = iVar1;
    }
  }
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Ticker()
{
	if (mClassNum < 0) UpdateRandomClass();

	if (mPlayerState != NULL && mPlayerState->GetTics () != -1 && mPlayerState->GetNextState () != NULL)
	{
		if (--mPlayerTics <= 0)
		{
			mPlayerState = mPlayerState->GetNextState();
			mPlayerTics = mPlayerState->GetTics();
		}
	}
}